

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrators.cpp
# Opt level: O2

SampledSpectrum __thiscall
pbrt::PathIntegrator::Li
          (PathIntegrator *this,RayDifferential *ray,SampledWavelengths *lambda,
          SamplerHandle *sampler,ScratchBuffer *scratchBuffer,VisibleSurface *visibleSurf)

{
  Vector3f *this_00;
  BxDFFlags flags;
  undefined4 uVar1;
  TaggedPointer<pbrt::PointLight,pbrt::DistantLight,pbrt::ProjectionLight,pbrt::GoniometricLight,pbrt::SpotLight,pbrt::DiffuseAreaLight,pbrt::UniformInfiniteLight,pbrt::ImageInfiniteLight,pbrt::PortalImageInfiniteLight>
  *pTVar2;
  undefined8 uVar3;
  undefined4 uVar4;
  float fVar5;
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  anon_class_24_3_20c75c41 func;
  anon_class_24_3_20c75c41 func_00;
  undefined8 uVar15;
  uintptr_t uVar16;
  undefined1 auVar17 [16];
  Tuple3<pbrt::Vector3,_float> wi;
  int iVar18;
  BxDFFlags BVar19;
  BxDFFlags BVar20;
  int iVar21;
  bool bVar22;
  byte bVar23;
  byte bVar24;
  ShapeIntersection *pSVar25;
  ShapeIntersection *pSVar26;
  BSDFSample *pBVar27;
  BSDFSample *pBVar28;
  long lVar29;
  long lVar30;
  LightHandle *light;
  TaggedPointer<pbrt::PointLight,pbrt::DistantLight,pbrt::ProjectionLight,pbrt::GoniometricLight,pbrt::SpotLight,pbrt::DiffuseAreaLight,pbrt::UniformInfiniteLight,pbrt::ImageInfiniteLight,pbrt::PortalImageInfiniteLight>
  *this_01;
  uint64_t a;
  long in_FS_OFFSET;
  Float FVar31;
  Float FVar32;
  type tVar33;
  Point2f u2;
  undefined4 extraout_XMM0_Dc;
  ulong uVar51;
  undefined1 auVar52 [56];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  ulong uVar56;
  undefined1 auVar53 [16];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dd;
  undefined1 extraout_var [56];
  undefined1 auVar43 [64];
  undefined1 auVar44 [64];
  undefined1 auVar45 [64];
  undefined1 auVar46 [64];
  undefined1 auVar47 [64];
  undefined1 extraout_var_00 [56];
  undefined1 auVar48 [64];
  undefined1 auVar49 [64];
  undefined1 auVar50 [64];
  uint uVar58;
  undefined1 in_ZMM1 [64];
  undefined1 auVar54 [64];
  undefined1 auVar57 [56];
  undefined1 auVar55 [64];
  Vector3<float> VVar59;
  SampledSpectrum SVar60;
  SampledSpectrum SVar61;
  anon_class_16_2_2793a994 func_01;
  anon_class_16_2_d8f97178 func_02;
  anon_class_16_2_d8f97178 func_03;
  undefined1 local_318 [16];
  float local_304;
  Float f;
  SampledSpectrum albedo;
  optional<pbrt::BSDFSample> bs;
  SampledSpectrum beta;
  SampledSpectrum L;
  SampledSpectrum Le;
  BSDF bsdf;
  LightHandle local_210;
  SampledSpectrum rrBeta;
  Float FStack_1f8;
  Float FStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  float fStack_1e4;
  float fStack_1e0;
  float fStack_1dc;
  undefined8 uStack_1d8;
  undefined4 uStack_1d0;
  undefined4 uStack_1cc;
  float local_1c8;
  undefined4 uStack_1c4;
  undefined4 uStack_1c0;
  undefined8 uStack_1bc;
  undefined8 uStack_1b4;
  LightSampleContext prevIntrCtx;
  TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
  local_168;
  undefined1 local_160 [16];
  uintptr_t local_150;
  TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
  local_148;
  TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
  local_140;
  optional<pbrt::ShapeIntersection> si;
  
  SampledSpectrum::SampledSpectrum(&L,0.0);
  SampledSpectrum::SampledSpectrum(&beta,1.0);
  bVar24 = 0;
  bVar23 = 0;
  iVar18 = 0;
  prevIntrCtx.n.super_Tuple3<pbrt::Normal3,_float>.z = 0.0;
  prevIntrCtx.ns.super_Tuple3<pbrt::Normal3,_float>.x = 0.0;
  prevIntrCtx.ns.super_Tuple3<pbrt::Normal3,_float>.y = 0.0;
  prevIntrCtx.ns.super_Tuple3<pbrt::Normal3,_float>.z = 0.0;
  prevIntrCtx.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.low = 0.0
  ;
  prevIntrCtx.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high =
       0.0;
  prevIntrCtx.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.low = 0.0
  ;
  prevIntrCtx.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high =
       0.0;
  prevIntrCtx.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.low = 0.0
  ;
  prevIntrCtx.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.high =
       0.0;
  prevIntrCtx.n.super_Tuple3<pbrt::Normal3,_float>.x = 0.0;
  prevIntrCtx.n.super_Tuple3<pbrt::Normal3,_float>.y = 0.0;
  this_00 = &(ray->super_Ray).d;
  local_304 = 1.0;
  do {
    auVar52 = ZEXT856(0);
    auVar54 = ZEXT1664(in_ZMM1._0_16_);
    Integrator::Intersect(&si,(Integrator *)this,&ray->super_Ray,INFINITY);
    auVar57 = auVar54._8_56_;
    iVar21 = iVar18;
    if (si.set == false) {
      this_01 = (TaggedPointer<pbrt::PointLight,pbrt::DistantLight,pbrt::ProjectionLight,pbrt::GoniometricLight,pbrt::SpotLight,pbrt::DiffuseAreaLight,pbrt::UniformInfiniteLight,pbrt::ImageInfiniteLight,pbrt::PortalImageInfiniteLight>
                 *)(this->super_RayIntegrator).super_ImageTileIntegrator.super_Integrator.
                   infiniteLights.
                   super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>._M_impl
                   .super__Vector_impl_data._M_start;
      pTVar2 = *(TaggedPointer<pbrt::PointLight,pbrt::DistantLight,pbrt::ProjectionLight,pbrt::GoniometricLight,pbrt::SpotLight,pbrt::DiffuseAreaLight,pbrt::UniformInfiniteLight,pbrt::ImageInfiniteLight,pbrt::PortalImageInfiniteLight>
                 **)((long)&(this->super_RayIntegrator).super_ImageTileIntegrator.super_Integrator.
                            infiniteLights.
                            super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>
                            ._M_impl.super__Vector_impl_data + 8);
      fVar5 = f * f;
      auVar36 = ZEXT464((uint)fVar5);
      while( true ) {
        auVar53 = auVar54._0_16_;
        auVar57 = auVar54._8_56_;
        auVar52 = auVar36._8_56_;
        if (this_01 == pTVar2) break;
        func_01.lambda = lambda;
        func_01.ray = &ray->super_Ray;
        SVar60 = TaggedPointer<pbrt::PointLight,pbrt::DistantLight,pbrt::ProjectionLight,pbrt::GoniometricLight,pbrt::SpotLight,pbrt::DiffuseAreaLight,pbrt::UniformInfiniteLight,pbrt::ImageInfiniteLight,pbrt::PortalImageInfiniteLight>
                 ::
                 Dispatch<pbrt::LightHandle::Le(pbrt::Ray_const&,pbrt::SampledWavelengths_const&)const::_lambda(auto:1)_1_>
                           (this_01,func_01);
        uVar56 = auVar57._0_8_;
        auVar36._8_56_ = auVar57;
        auVar36._0_8_ = SVar60.values.values._8_8_;
        auVar37._0_8_ = SVar60.values.values._0_8_;
        auVar37._8_56_ = auVar52;
        bs.optionalValue._0_16_ = vmovlhps_avx(auVar37._0_16_,auVar36._0_16_);
        uVar51 = bs.optionalValue._8_8_;
        if (iVar18 == 0 || (bVar23 & 1) != 0) {
          SVar60 = SampledSpectrum::operator*(&beta,(SampledSpectrum *)&bs);
          SVar61 = SampledWavelengths::PDF(lambda);
          auVar57 = ZEXT856(uVar56);
          auVar52 = ZEXT856(uVar51);
          SVar60 = SafeDiv(SVar60,SVar61);
          auVar54._8_56_ = auVar57;
          auVar54._0_8_ = SVar60.values.values._8_8_;
          auVar38._0_8_ = SVar60.values.values._0_8_;
          auVar38._8_56_ = auVar52;
          auVar53 = auVar38._0_16_;
        }
        else {
          local_210.
          super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
          .bits = *(TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
                    *)this_01;
          func_02.light = &local_210;
          func_02.ctx = &prevIntrCtx;
          FVar31 = TaggedPointer<pbrt::UniformLightSampler,pbrt::PowerLightSampler,pbrt::BVHLightSampler,pbrt::ExhaustiveLightSampler>
                   ::
                   Dispatch<pbrt::LightSamplerHandle::PDF(pbrt::LightSampleContext_const&,pbrt::LightHandle)const::_lambda(auto:1)_1_>
                             ((TaggedPointer<pbrt::UniformLightSampler,pbrt::PowerLightSampler,pbrt::BVHLightSampler,pbrt::ExhaustiveLightSampler>
                               *)&this->lightSampler,func_02);
          fStack_1e8 = prevIntrCtx.n.super_Tuple3<pbrt::Normal3,_float>.z;
          fStack_1e4 = prevIntrCtx.ns.super_Tuple3<pbrt::Normal3,_float>.x;
          fStack_1e0 = prevIntrCtx.ns.super_Tuple3<pbrt::Normal3,_float>.y;
          fStack_1dc = prevIntrCtx.ns.super_Tuple3<pbrt::Normal3,_float>.z;
          rrBeta.values.values[0] =
               prevIntrCtx.pi.super_Point3<pbrt::Interval>.
               super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.low;
          rrBeta.values.values[1] =
               prevIntrCtx.pi.super_Point3<pbrt::Interval>.
               super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high;
          rrBeta.values.values[2] =
               prevIntrCtx.pi.super_Point3<pbrt::Interval>.
               super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.low;
          rrBeta.values.values[3] =
               prevIntrCtx.pi.super_Point3<pbrt::Interval>.
               super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high;
          FStack_1f8 = prevIntrCtx.pi.super_Point3<pbrt::Interval>.
                       super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.low;
          FStack_1f4 = prevIntrCtx.pi.super_Point3<pbrt::Interval>.
                       super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.high;
          fStack_1f0 = prevIntrCtx.n.super_Tuple3<pbrt::Normal3,_float>.x;
          fStack_1ec = prevIntrCtx.n.super_Tuple3<pbrt::Normal3,_float>.y;
          auVar53._12_4_ = 0;
          auVar53._0_4_ = albedo.values.values[1];
          auVar53._4_4_ = albedo.values.values[2];
          auVar53._8_4_ = albedo.values.values[3];
          albedo.values.values = (array<float,_4>)(auVar53 << 0x20);
          bsdf.ng.super_Tuple3<pbrt::Normal3,_float>._0_8_ = &Le;
          bsdf.bxdf.
          super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::NormalizedFresnelBxDF>
          .bits = (TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::NormalizedFresnelBxDF>
                   )(TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::NormalizedFresnelBxDF>
                     )&rrBeta;
          bsdf._16_8_ = &albedo;
          Le.values.values._0_12_ = (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>;
          func.wi = (Vector3f *)&Le;
          func.ctx = (LightSampleContext *)&rrBeta;
          func.mode = (LightSamplingMode *)bsdf._16_8_;
          FVar32 = TaggedPointer<pbrt::PointLight,pbrt::DistantLight,pbrt::ProjectionLight,pbrt::GoniometricLight,pbrt::SpotLight,pbrt::DiffuseAreaLight,pbrt::UniformInfiniteLight,pbrt::ImageInfiniteLight,pbrt::PortalImageInfiniteLight>
                   ::
                   Dispatch<pbrt::LightHandle::PDF_Li(pbrt::LightSampleContext,pbrt::Vector3<float>,pbrt::LightSamplingMode)const::_lambda(auto:1)_1_>
                             (this_01,func);
          auVar57 = (undefined1  [56])0x0;
          auVar52 = ZEXT856(0);
          SVar60 = SampledSpectrum::operator*
                             (&beta,fVar5 / (fVar5 + FVar32 * FVar31 * FVar32 * FVar31));
          uVar56 = auVar57._0_8_;
          auVar6._8_56_ = auVar57;
          auVar6._0_8_ = SVar60.values.values._8_8_;
          auVar39._0_8_ = SVar60.values.values._0_8_;
          auVar39._8_56_ = auVar52;
          bsdf._0_16_ = vmovlhps_avx(auVar39._0_16_,auVar6._0_16_);
          uVar51 = bsdf.ng.super_Tuple3<pbrt::Normal3,_float>._0_8_;
          SVar60 = SampledSpectrum::operator*((SampledSpectrum *)&bsdf,(SampledSpectrum *)&bs);
          SVar61 = SampledWavelengths::PDF(lambda);
          auVar57 = ZEXT856(uVar56);
          auVar52 = ZEXT856(uVar51);
          SVar60 = SafeDiv(SVar60,SVar61);
          auVar54._8_56_ = auVar57;
          auVar54._0_8_ = SVar60.values.values._8_8_;
          auVar40._0_8_ = SVar60.values.values._0_8_;
          auVar40._8_56_ = auVar52;
          auVar53 = auVar40._0_16_;
        }
        auVar53 = vmovlhps_avx(auVar53,auVar54._0_16_);
        auVar36 = ZEXT1664(auVar53);
        rrBeta.values.values._0_8_ = auVar53._0_8_;
        rrBeta.values.values[2] = auVar53._8_4_;
        rrBeta.values.values[3] = auVar53._12_4_;
        SampledSpectrum::operator+=(&L,&rrBeta);
        this_01 = this_01 + 8;
      }
      bVar22 = true;
    }
    else {
      pSVar25 = pstd::optional<pbrt::ShapeIntersection>::value(&si);
      VVar59 = Tuple3<pbrt::Vector3,_float>::operator-(&this_00->super_Tuple3<pbrt::Vector3,_float>)
      ;
      SVar60 = SurfaceInteraction::Le
                         (&pSVar25->intr,(Vector3f)VVar59.super_Tuple3<pbrt::Vector3,_float>,lambda)
      ;
      auVar55._8_56_ = auVar57;
      auVar55._0_8_ = SVar60.values.values._8_8_;
      auVar34._0_8_ = SVar60.values.values._0_8_;
      auVar34._8_56_ = auVar52;
      Le.values.values = (array<float,_4>)vmovlhps_avx(auVar34._0_16_,auVar55._0_16_);
      uVar51 = Le.values.values._8_8_;
      bVar22 = SampledSpectrum::operator_cast_to_bool(&Le);
      uVar56 = auVar55._8_8_;
      if (bVar22) {
        if ((iVar18 == 0) || ((bVar23 & 1) != 0)) {
          SVar60 = SampledSpectrum::operator*(&beta,&Le);
          SVar61 = SampledWavelengths::PDF(lambda);
          auVar57 = ZEXT856(uVar56);
          auVar52 = ZEXT856(uVar51);
          SVar60 = SafeDiv(SVar60,SVar61);
          auVar55._8_56_ = auVar57;
          auVar55._0_8_ = SVar60.values.values._8_8_;
          auVar35._0_8_ = SVar60.values.values._0_8_;
          auVar35._8_56_ = auVar52;
          auVar53 = auVar35._0_16_;
        }
        else {
          pSVar25 = pstd::optional<pbrt::ShapeIntersection>::value(&si);
          local_140.bits =
               (pSVar25->intr).areaLight.
               super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
               .bits;
          albedo.values.values[0] = (float)(int)local_140.bits;
          albedo.values.values[1] = (float)(int)(local_140.bits >> 0x20);
          func_03.light = (LightHandle *)&local_140;
          func_03.ctx = &prevIntrCtx;
          FVar31 = TaggedPointer<pbrt::UniformLightSampler,pbrt::PowerLightSampler,pbrt::BVHLightSampler,pbrt::ExhaustiveLightSampler>
                   ::
                   Dispatch<pbrt::LightSamplerHandle::PDF(pbrt::LightSampleContext_const&,pbrt::LightHandle)const::_lambda(auto:1)_1_>
                             ((TaggedPointer<pbrt::UniformLightSampler,pbrt::PowerLightSampler,pbrt::BVHLightSampler,pbrt::ExhaustiveLightSampler>
                               *)&this->lightSampler,func_03);
          fStack_1e8 = prevIntrCtx.n.super_Tuple3<pbrt::Normal3,_float>.z;
          fStack_1e4 = prevIntrCtx.ns.super_Tuple3<pbrt::Normal3,_float>.x;
          fStack_1e0 = prevIntrCtx.ns.super_Tuple3<pbrt::Normal3,_float>.y;
          fStack_1dc = prevIntrCtx.ns.super_Tuple3<pbrt::Normal3,_float>.z;
          rrBeta.values.values[0] =
               prevIntrCtx.pi.super_Point3<pbrt::Interval>.
               super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.low;
          rrBeta.values.values[1] =
               prevIntrCtx.pi.super_Point3<pbrt::Interval>.
               super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high;
          rrBeta.values.values[2] =
               prevIntrCtx.pi.super_Point3<pbrt::Interval>.
               super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.low;
          rrBeta.values.values[3] =
               prevIntrCtx.pi.super_Point3<pbrt::Interval>.
               super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high;
          FStack_1f8 = prevIntrCtx.pi.super_Point3<pbrt::Interval>.
                       super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.low;
          FStack_1f4 = prevIntrCtx.pi.super_Point3<pbrt::Interval>.
                       super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.high;
          fStack_1f0 = prevIntrCtx.n.super_Tuple3<pbrt::Normal3,_float>.x;
          fStack_1ec = prevIntrCtx.n.super_Tuple3<pbrt::Normal3,_float>.y;
          auVar17._12_4_ = 0;
          auVar17._0_12_ = local_160._4_12_;
          local_160 = auVar17 << 0x20;
          bsdf.ng.super_Tuple3<pbrt::Normal3,_float>._0_8_ = &bs;
          bsdf.bxdf.
          super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::NormalizedFresnelBxDF>
          .bits = (TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::NormalizedFresnelBxDF>
                   )(TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::NormalizedFresnelBxDF>
                     )&rrBeta;
          bsdf._16_8_ = local_160;
          bs.optionalValue._0_12_ =
               (undefined1  [12])(ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>;
          func_00.wi = (Vector3f *)&bs;
          func_00.ctx = (LightSampleContext *)&rrBeta;
          func_00.mode = (LightSamplingMode *)bsdf._16_8_;
          FVar32 = TaggedPointer<pbrt::PointLight,pbrt::DistantLight,pbrt::ProjectionLight,pbrt::GoniometricLight,pbrt::SpotLight,pbrt::DiffuseAreaLight,pbrt::UniformInfiniteLight,pbrt::ImageInfiniteLight,pbrt::PortalImageInfiniteLight>
                   ::
                   Dispatch<pbrt::LightHandle::PDF_Li(pbrt::LightSampleContext,pbrt::Vector3<float>,pbrt::LightSamplingMode)const::_lambda(auto:1)_1_>
                             ((TaggedPointer<pbrt::PointLight,pbrt::DistantLight,pbrt::ProjectionLight,pbrt::GoniometricLight,pbrt::SpotLight,pbrt::DiffuseAreaLight,pbrt::UniformInfiniteLight,pbrt::ImageInfiniteLight,pbrt::PortalImageInfiniteLight>
                               *)&albedo,func_00);
          auVar57 = (undefined1  [56])0x0;
          auVar52 = ZEXT856(0);
          SVar60 = SampledSpectrum::operator*
                             (&beta,(f * f) / (f * f + FVar32 * FVar31 * FVar32 * FVar31));
          uVar56 = auVar57._0_8_;
          auVar7._8_56_ = auVar57;
          auVar7._0_8_ = SVar60.values.values._8_8_;
          auVar41._0_8_ = SVar60.values.values._0_8_;
          auVar41._8_56_ = auVar52;
          bsdf._0_16_ = vmovlhps_avx(auVar41._0_16_,auVar7._0_16_);
          uVar51 = bsdf.ng.super_Tuple3<pbrt::Normal3,_float>._0_8_;
          SVar60 = SampledSpectrum::operator*((SampledSpectrum *)&bsdf,&Le);
          SVar61 = SampledWavelengths::PDF(lambda);
          auVar57 = ZEXT856(uVar56);
          auVar52 = ZEXT856(uVar51);
          SVar60 = SafeDiv(SVar60,SVar61);
          auVar55._8_56_ = auVar57;
          auVar55._0_8_ = SVar60.values.values._8_8_;
          auVar42._0_8_ = SVar60.values.values._0_8_;
          auVar42._8_56_ = auVar52;
          auVar53 = auVar42._0_16_;
        }
        auVar53 = vmovlhps_avx(auVar53,auVar55._0_16_);
        uVar51 = auVar53._8_8_;
        rrBeta.values.values._0_8_ = auVar53._0_8_;
        rrBeta.values.values[2] = auVar53._8_4_;
        rrBeta.values.values[3] = auVar53._12_4_;
        SampledSpectrum::operator+=(&L,&rrBeta);
      }
      pSVar25 = pstd::optional<pbrt::ShapeIntersection>::value(&si);
      local_148.bits =
           (this->super_RayIntegrator).super_ImageTileIntegrator.camera.
           super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
           .bits;
      local_150 = (sampler->
                  super_TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
                  ).bits;
      SurfaceInteraction::GetBSDF
                (&bsdf,&pSVar25->intr,ray,lambda,(CameraHandle *)&local_148,scratchBuffer,
                 (SamplerHandle)&local_150);
      auVar53 = auVar55._0_16_;
      if (((undefined1  [16])bsdf._0_16_ & (undefined1  [16])0xffffffffffff) ==
          (undefined1  [16])0x0) {
        pSVar26 = pstd::optional<pbrt::ShapeIntersection>::value(&si);
        SurfaceInteraction::SkipIntersection(&pSVar25->intr,ray,pSVar26->tHit);
        bVar22 = false;
      }
      else {
        if (iVar18 == 0 && visibleSurf != (VisibleSurface *)0x0) {
          SampledSpectrum::SampledSpectrum((SampledSpectrum *)&bs,0.0);
          for (a = 1; auVar57 = auVar55._8_56_, a != 0x11; a = a + 1) {
            FVar31 = RadicalInverse(0,a);
            local_318._0_4_ = RadicalInverse(1,a);
            local_318._4_4_ = extraout_XMM0_Db;
            local_318._8_4_ = extraout_XMM0_Dc;
            local_318._12_4_ = extraout_XMM0_Dd;
            FVar32 = RadicalInverse(2,a);
            pSVar26 = pstd::optional<pbrt::ShapeIntersection>::value(&si);
            auVar53 = vinsertps_avx(local_318,ZEXT416((uint)FVar32),0x10);
            auVar55 = ZEXT6064((undefined1  [60])0x0) << 0x20;
            BSDF::Sample_f((optional<pbrt::BSDFSample> *)&rrBeta,&bsdf,
                           (Vector3f)
                           (pSVar26->intr).super_Interaction.wo.super_Tuple3<pbrt::Vector3,_float>,
                           FVar31,(Point2f)auVar53._0_8_,Radiance,All);
            auVar57 = auVar55._8_56_;
            if (fStack_1dc._0_1_ == '\x01') {
              pBVar27 = pstd::optional<pbrt::BSDFSample>::value
                                  ((optional<pbrt::BSDFSample> *)&rrBeta);
              pBVar28 = pstd::optional<pbrt::BSDFSample>::value
                                  ((optional<pbrt::BSDFSample> *)&rrBeta);
              pSVar26 = pstd::optional<pbrt::ShapeIntersection>::value(&si);
              tVar33 = AbsDot<float>(&pBVar28->wi,&(pSVar26->intr).shading.n);
              auVar52 = extraout_var;
              SVar60 = SampledSpectrum::operator*(&pBVar27->f,tVar33);
              auVar8._8_56_ = auVar57;
              auVar8._0_8_ = SVar60.values.values._8_8_;
              auVar43._0_8_ = SVar60.values.values._0_8_;
              auVar43._8_56_ = auVar52;
              local_160 = vmovlhps_avx(auVar43._0_16_,auVar8._0_16_);
              pBVar27 = pstd::optional<pbrt::BSDFSample>::value
                                  ((optional<pbrt::BSDFSample> *)&rrBeta);
              auVar52 = (undefined1  [56])0x0;
              SVar60 = SampledSpectrum::operator/((SampledSpectrum *)local_160,pBVar27->pdf);
              auVar55._8_56_ = auVar57;
              auVar55._0_8_ = SVar60.values.values._8_8_;
              auVar44._0_8_ = SVar60.values.values._0_8_;
              auVar44._8_56_ = auVar52;
              albedo.values.values = (array<float,_4>)vmovlhps_avx(auVar44._0_16_,auVar55._0_16_);
              SampledSpectrum::operator+=((SampledSpectrum *)&bs,&albedo);
            }
            pstd::optional<pbrt::BSDFSample>::~optional((optional<pbrt::BSDFSample> *)&rrBeta);
          }
          auVar52 = (undefined1  [56])0x0;
          SVar60 = SampledSpectrum::operator/((SampledSpectrum *)&bs,16.0);
          auVar9._8_56_ = auVar57;
          auVar9._0_8_ = SVar60.values.values._8_8_;
          auVar45._0_8_ = SVar60.values.values._0_8_;
          auVar45._8_56_ = auVar52;
          auVar53 = auVar9._0_16_;
          albedo.values.values = (array<float,_4>)vmovlhps_avx(auVar45._0_16_,auVar53);
          pSVar26 = pstd::optional<pbrt::ShapeIntersection>::value(&si);
          VisibleSurface::VisibleSurface
                    ((VisibleSurface *)&rrBeta,&pSVar26->intr,
                     (CameraTransform *)
                     ((this->super_RayIntegrator).super_ImageTileIntegrator.camera.
                      super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
                      .bits & 0xffffffffffff),&albedo,lambda);
          (visibleSurf->albedo).values.values[3] = local_1c8;
          uVar51 = CONCAT44(rrBeta.values.values[3],rrBeta.values.values[2]);
          *(undefined8 *)visibleSurf = rrBeta.values.values._0_8_;
          (visibleSurf->p).super_Tuple3<pbrt::Point3,_float>.y = rrBeta.values.values[2];
          (visibleSurf->p).super_Tuple3<pbrt::Point3,_float>.z = rrBeta.values.values[3];
          (visibleSurf->n).super_Tuple3<pbrt::Normal3,_float>.x = FStack_1f8;
          (visibleSurf->n).super_Tuple3<pbrt::Normal3,_float>.y = FStack_1f4;
          *(ulong *)&(visibleSurf->n).super_Tuple3<pbrt::Normal3,_float>.z =
               CONCAT44(fStack_1ec,fStack_1f0);
          (visibleSurf->ns).super_Tuple3<pbrt::Normal3,_float>.y = fStack_1e8;
          (visibleSurf->ns).super_Tuple3<pbrt::Normal3,_float>.z = fStack_1e4;
          visibleSurf->time = fStack_1e0;
          visibleSurf->dzdx = fStack_1dc;
          visibleSurf->dzdy = (Float)(undefined4)uStack_1d8;
          (visibleSurf->albedo).values.values[0] = (float)uStack_1d8._4_4_;
          *(ulong *)((visibleSurf->albedo).values.values + 1) = CONCAT44(uStack_1cc,uStack_1d0);
        }
        uVar58 = auVar53._12_4_;
        bVar22 = true;
        iVar21 = iVar18 + 1;
        if (iVar18 != this->maxDepth) {
          if ((this->regularize & bVar24) == 1) {
            *(long *)(in_FS_OFFSET + -0x2a0) = *(long *)(in_FS_OFFSET + -0x2a0) + 1;
            TaggedPointer<pbrt::IdealDiffuseBxDF,pbrt::DiffuseBxDF,pbrt::CoatedDiffuseBxDF,pbrt::CoatedConductorBxDF,pbrt::DielectricInterfaceBxDF,pbrt::ThinDielectricBxDF,pbrt::HairBxDF,pbrt::MeasuredBxDF,pbrt::ConductorBxDF,pbrt::NormalizedFresnelBxDF>
            ::Dispatch<pbrt::BxDFHandle::Regularize()::_lambda(auto:1)_1_>
                      ((TaggedPointer<pbrt::IdealDiffuseBxDF,pbrt::DiffuseBxDF,pbrt::CoatedDiffuseBxDF,pbrt::CoatedConductorBxDF,pbrt::DielectricInterfaceBxDF,pbrt::ThinDielectricBxDF,pbrt::HairBxDF,pbrt::MeasuredBxDF,pbrt::ConductorBxDF,pbrt::NormalizedFresnelBxDF>
                        *)&bsdf);
          }
          *(long *)(in_FS_OFFSET + -0x298) = *(long *)(in_FS_OFFSET + -0x298) + 1;
          auVar52 = ZEXT856(uVar51);
          auVar57 = ZEXT456(uVar58);
          bVar22 = BSDF::IsNonSpecular(&bsdf);
          if (bVar22) {
            *(long *)(in_FS_OFFSET + -0x290) = *(long *)(in_FS_OFFSET + -0x290) + 1;
            local_168.bits =
                 (sampler->
                 super_TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
                 ).bits;
            SVar60 = SampleLd(this,&pSVar25->intr,&bsdf,lambda,(SamplerHandle *)&local_168);
            uVar56 = auVar57._0_8_;
            auVar10._8_56_ = auVar57;
            auVar10._0_8_ = SVar60.values.values._8_8_;
            auVar46._0_8_ = SVar60.values.values._0_8_;
            auVar46._8_56_ = auVar52;
            auVar53 = vmovlhps_avx(auVar46._0_16_,auVar10._0_16_);
            uVar51 = auVar53._8_8_;
            rrBeta.values.values._0_8_ = auVar53._0_8_;
            rrBeta.values.values[2] = auVar53._8_4_;
            rrBeta.values.values[3] = auVar53._12_4_;
            bVar22 = SampledSpectrum::operator_cast_to_bool(&rrBeta);
            if (!bVar22) {
              *(long *)(in_FS_OFFSET + -0x288) = *(long *)(in_FS_OFFSET + -0x288) + 1;
            }
            SVar60 = SampledSpectrum::operator*(&beta,&rrBeta);
            SVar61 = SampledWavelengths::PDF(lambda);
            auVar57 = ZEXT856(uVar56);
            auVar52 = ZEXT856(uVar51);
            SVar60 = SafeDiv(SVar60,SVar61);
            auVar11._8_56_ = auVar57;
            auVar11._0_8_ = SVar60.values.values._8_8_;
            auVar47._0_8_ = SVar60.values.values._0_8_;
            auVar47._8_56_ = auVar52;
            bs.optionalValue._0_16_ = vmovlhps_avx(auVar47._0_16_,auVar11._0_16_);
            SampledSpectrum::operator+=(&L,(SampledSpectrum *)&bs);
          }
          VVar59 = Tuple3<pbrt::Vector3,_float>::operator-
                             (&this_00->super_Tuple3<pbrt::Vector3,_float>);
          FVar31 = TaggedPointer<pbrt::RandomSampler,pbrt::StratifiedSampler,pbrt::HaltonSampler,pbrt::PaddedSobolSampler,pbrt::SobolSampler,pbrt::ZSobolSampler,pbrt::PMJ02BNSampler,pbrt::MLTSampler,pbrt::DebugMLTSampler>
                   ::Dispatch<pbrt::SamplerHandle::Get1D()::_lambda(auto:1)_1_>
                             ((TaggedPointer<pbrt::RandomSampler,pbrt::StratifiedSampler,pbrt::HaltonSampler,pbrt::PaddedSobolSampler,pbrt::SobolSampler,pbrt::ZSobolSampler,pbrt::PMJ02BNSampler,pbrt::MLTSampler,pbrt::DebugMLTSampler>
                               *)sampler);
          u2 = TaggedPointer<pbrt::RandomSampler,pbrt::StratifiedSampler,pbrt::HaltonSampler,pbrt::PaddedSobolSampler,pbrt::SobolSampler,pbrt::ZSobolSampler,pbrt::PMJ02BNSampler,pbrt::MLTSampler,pbrt::DebugMLTSampler>
               ::Dispatch<pbrt::SamplerHandle::Get2D()::_lambda(auto:1)_1_>
                         ((TaggedPointer<pbrt::RandomSampler,pbrt::StratifiedSampler,pbrt::HaltonSampler,pbrt::PaddedSobolSampler,pbrt::SobolSampler,pbrt::ZSobolSampler,pbrt::PMJ02BNSampler,pbrt::MLTSampler,pbrt::DebugMLTSampler>
                           *)sampler);
          auVar54 = ZEXT6064((undefined1  [60])0x0) << 0x20;
          BSDF::Sample_f(&bs,&bsdf,(Vector3f)VVar59.super_Tuple3<pbrt::Vector3,_float>,FVar31,u2,
                         Radiance,All);
          auVar53 = auVar54._0_16_;
          auVar57 = auVar54._8_56_;
          bVar22 = true;
          if (bs.set != false) {
            pBVar27 = pstd::optional<pbrt::BSDFSample>::value(&bs);
            pBVar28 = pstd::optional<pbrt::BSDFSample>::value(&bs);
            tVar33 = AbsDot<float>(&pBVar28->wi,&(pSVar25->intr).shading.n);
            auVar52 = extraout_var_00;
            SVar60 = SampledSpectrum::operator*(&pBVar27->f,tVar33);
            auVar12._8_56_ = auVar57;
            auVar12._0_8_ = SVar60.values.values._8_8_;
            auVar48._0_8_ = SVar60.values.values._0_8_;
            auVar48._8_56_ = auVar52;
            albedo.values.values = (array<float,_4>)vmovlhps_avx(auVar48._0_16_,auVar12._0_16_);
            pBVar27 = pstd::optional<pbrt::BSDFSample>::value(&bs);
            auVar52 = (undefined1  [56])0x0;
            SVar60 = SampledSpectrum::operator/(&albedo,pBVar27->pdf);
            auVar13._8_56_ = auVar57;
            auVar13._0_8_ = SVar60.values.values._8_8_;
            auVar49._0_8_ = SVar60.values.values._0_8_;
            auVar49._8_56_ = auVar52;
            auVar53 = vmovlhps_avx(auVar49._0_16_,auVar13._0_16_);
            rrBeta.values.values._0_8_ = auVar53._0_8_;
            rrBeta.values.values[2] = auVar53._8_4_;
            rrBeta.values.values[3] = auVar53._12_4_;
            SampledSpectrum::operator*=(&beta,&rrBeta);
            pBVar27 = pstd::optional<pbrt::BSDFSample>::value(&bs);
            if (pBVar27->pdfIsProportional == true) {
              pBVar27 = pstd::optional<pbrt::BSDFSample>::value(&bs);
              f = BSDF::PDF(&bsdf,(Vector3f)VVar59.super_Tuple3<pbrt::Vector3,_float>,
                            (Vector3f)(pBVar27->wi).super_Tuple3<pbrt::Vector3,_float>,Radiance,All)
              ;
            }
            else {
              pBVar27 = pstd::optional<pbrt::BSDFSample>::value(&bs);
              f = pBVar27->pdf;
            }
            pBVar27 = pstd::optional<pbrt::BSDFSample>::value(&bs);
            BVar19 = pBVar27->flags;
            pBVar27 = pstd::optional<pbrt::BSDFSample>::value(&bs);
            BVar20 = pBVar27->flags;
            pBVar27 = pstd::optional<pbrt::BSDFSample>::value(&bs);
            if ((pBVar27->flags & Transmission) != Unset) {
              pBVar27 = pstd::optional<pbrt::BSDFSample>::value(&bs);
              local_304 = local_304 * pBVar27->eta * pBVar27->eta;
            }
            pSVar26 = pstd::optional<pbrt::ShapeIntersection>::value(&si);
            prevIntrCtx.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z
                 = (pSVar26->intr).super_Interaction.pi.super_Point3<pbrt::Interval>.
                   super_Tuple3<pbrt::Point3,_pbrt::Interval>.z;
            FStack_1f8 = prevIntrCtx.pi.super_Point3<pbrt::Interval>.
                         super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.low;
            FStack_1f4 = prevIntrCtx.pi.super_Point3<pbrt::Interval>.
                         super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.high;
            rrBeta.values.values._0_8_ =
                 (pSVar26->intr).super_Interaction.pi.super_Point3<pbrt::Interval>.
                 super_Tuple3<pbrt::Point3,_pbrt::Interval>.x;
            prevIntrCtx.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y
                 = (pSVar26->intr).super_Interaction.pi.super_Point3<pbrt::Interval>.
                   super_Tuple3<pbrt::Point3,_pbrt::Interval>.y;
            rrBeta.values.values[2] =
                 prevIntrCtx.pi.super_Point3<pbrt::Interval>.
                 super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.low;
            rrBeta.values.values[3] =
                 prevIntrCtx.pi.super_Point3<pbrt::Interval>.
                 super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high;
            fStack_1e8 = (pSVar26->intr).super_Interaction.n.super_Tuple3<pbrt::Normal3,_float>.z;
            uVar3._0_4_ = (pSVar26->intr).super_Interaction.n.super_Tuple3<pbrt::Normal3,_float>.x;
            uVar3._4_4_ = (pSVar26->intr).super_Interaction.n.super_Tuple3<pbrt::Normal3,_float>.y;
            fStack_1dc = (pSVar26->intr).shading.n.super_Tuple3<pbrt::Normal3,_float>.z;
            uVar1 = (pSVar26->intr).shading.n.super_Tuple3<pbrt::Normal3,_float>.x;
            uVar4 = (pSVar26->intr).shading.n.super_Tuple3<pbrt::Normal3,_float>.y;
            prevIntrCtx.ns.super_Tuple3<pbrt::Normal3,_float>.x = (float)uVar1;
            prevIntrCtx.n.super_Tuple3<pbrt::Normal3,_float>.z = fStack_1e8;
            prevIntrCtx.ns.super_Tuple3<pbrt::Normal3,_float>.z = fStack_1dc;
            prevIntrCtx.ns.super_Tuple3<pbrt::Normal3,_float>.y = (float)uVar4;
            prevIntrCtx.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x
                 = (Interval)rrBeta.values.values._0_8_;
            prevIntrCtx.n.super_Tuple3<pbrt::Normal3,_float>._0_8_ = uVar3;
            pBVar27 = pstd::optional<pbrt::BSDFSample>::value(&bs);
            wi = (pBVar27->wi).super_Tuple3<pbrt::Vector3,_float>;
            pBVar27 = pstd::optional<pbrt::BSDFSample>::value(&bs);
            flags = pBVar27->flags;
            pBVar27 = pstd::optional<pbrt::BSDFSample>::value(&bs);
            SurfaceInteraction::SpawnRay
                      ((RayDifferential *)&rrBeta,&pSVar25->intr,ray,&bsdf,(Vector3f)wi,flags,
                       pBVar27->eta);
            uVar15 = CONCAT44((float)uVar3,FStack_1f4);
            (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.x = rrBeta.values.values[3];
            (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.y = FStack_1f8;
            *(undefined8 *)&(ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.z = uVar15;
            (ray->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.x = rrBeta.values.values[0];
            (ray->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.y = rrBeta.values.values[1];
            *(ulong *)&(ray->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.z =
                 CONCAT44(rrBeta.values.values[3],rrBeta.values.values[2]);
            uVar16 = CONCAT44(uVar1,fStack_1e8);
            (ray->super_Ray).medium.
            super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
            .bits = uVar16;
            (ray->ryOrigin).super_Tuple3<pbrt::Point3,_float>.y = (float)uStack_1cc;
            (ray->ryOrigin).super_Tuple3<pbrt::Point3,_float>.z = local_1c8;
            (ray->rxDirection).super_Tuple3<pbrt::Vector3,_float>.x = (float)uStack_1c4;
            (ray->rxDirection).super_Tuple3<pbrt::Vector3,_float>.y = (float)uStack_1c0;
            *(undefined8 *)&(ray->rxDirection).super_Tuple3<pbrt::Vector3,_float>.z = uStack_1bc;
            (ray->ryDirection).super_Tuple3<pbrt::Vector3,_float>.y = (float)(undefined4)uStack_1b4;
            (ray->ryDirection).super_Tuple3<pbrt::Vector3,_float>.z = (float)uStack_1b4._4_4_;
            ray->hasDifferentials = (bool)(char)uVar4;
            *(int3 *)&ray->field_0x29 = (int3)((uint)uVar4 >> 8);
            (ray->rxOrigin).super_Tuple3<pbrt::Point3,_float>.x = fStack_1dc;
            (ray->rxOrigin).super_Tuple3<pbrt::Point3,_float>.y = (float)(undefined4)uStack_1d8;
            (ray->rxOrigin).super_Tuple3<pbrt::Point3,_float>.z = (float)uStack_1d8._4_4_;
            (ray->ryOrigin).super_Tuple3<pbrt::Point3,_float>.x = (float)uStack_1d0;
            (ray->ryOrigin).super_Tuple3<pbrt::Point3,_float>.y = (float)uStack_1cc;
            *(ulong *)&(ray->ryOrigin).super_Tuple3<pbrt::Point3,_float>.z =
                 CONCAT44(uStack_1c4,local_1c8);
            auVar52 = (undefined1  [56])0x0;
            auVar57 = ZEXT856(CONCAT44(uStack_1c0,uStack_1c4));
            SVar60 = SampledSpectrum::operator*(&beta,local_304);
            auVar14._8_56_ = auVar57;
            auVar14._0_8_ = SVar60.values.values._8_8_;
            auVar50._0_8_ = SVar60.values.values._0_8_;
            auVar50._8_56_ = auVar52;
            auVar53 = vmovlhps_avx(auVar50._0_16_,auVar14._0_16_);
            rrBeta.values.values._0_8_ = auVar53._0_8_;
            rrBeta.values.values[2] = auVar53._8_4_;
            rrBeta.values.values[3] = auVar53._12_4_;
            FVar31 = SampledSpectrum::MaxComponentValue(&rrBeta);
            auVar53 = SUB6416(ZEXT464(0x3f800000),0);
            if (iVar18 < 1 || 1.0 <= FVar31) {
LAB_00411257:
              bVar22 = false;
            }
            else {
              FVar31 = SampledSpectrum::MaxComponentValue(&rrBeta);
              FVar32 = TaggedPointer<pbrt::RandomSampler,pbrt::StratifiedSampler,pbrt::HaltonSampler,pbrt::PaddedSobolSampler,pbrt::SobolSampler,pbrt::ZSobolSampler,pbrt::PMJ02BNSampler,pbrt::MLTSampler,pbrt::DebugMLTSampler>
                       ::Dispatch<pbrt::SamplerHandle::Get1D()::_lambda(auto:1)_1_>
                                 ((TaggedPointer<pbrt::RandomSampler,pbrt::StratifiedSampler,pbrt::HaltonSampler,pbrt::PaddedSobolSampler,pbrt::SobolSampler,pbrt::ZSobolSampler,pbrt::PMJ02BNSampler,pbrt::MLTSampler,pbrt::DebugMLTSampler>
                                   *)sampler);
              bVar22 = true;
              auVar53 = vmaxss_avx(ZEXT416((uint)(1.0 - FVar31)),ZEXT416(0));
              if (auVar53._0_4_ <= FVar32) {
                SampledSpectrum::operator/=(&beta,1.0 - auVar53._0_4_);
                goto LAB_00411257;
              }
            }
            bVar23 = (byte)(char)BVar19 >> 4;
            bVar24 = bVar24 | (BVar20 & Specular) == Unset;
            fStack_1f0 = (float)uVar3;
            fStack_1ec = uVar3._4_4_;
            fStack_1e4 = (float)uVar1;
            fStack_1e0 = (float)uVar4;
          }
          pstd::optional<pbrt::BSDFSample>::~optional(&bs);
        }
      }
    }
    iVar18 = iVar21;
    in_ZMM1 = ZEXT1664(auVar53);
    pstd::optional<pbrt::ShapeIntersection>::~optional(&si);
    if (bVar22) {
      lVar29 = (long)iVar18;
      *(long *)(in_FS_OFFSET + -0x278) = *(long *)(in_FS_OFFSET + -0x278) + 1;
      *(long *)(in_FS_OFFSET + -0x280) = *(long *)(in_FS_OFFSET + -0x280) + lVar29;
      lVar30 = *(long *)(in_FS_OFFSET + -0x6c0);
      if (lVar29 <= *(long *)(in_FS_OFFSET + -0x6c0)) {
        lVar30 = lVar29;
      }
      if (lVar29 < *(long *)(in_FS_OFFSET + -0x6b8)) {
        lVar29 = *(long *)(in_FS_OFFSET + -0x6b8);
      }
      *(long *)(in_FS_OFFSET + -0x6c0) = lVar30;
      *(long *)(in_FS_OFFSET + -0x6b8) = lVar29;
      return (SampledSpectrum)L.values;
    }
  } while( true );
}

Assistant:

SampledSpectrum PathIntegrator::Li(RayDifferential ray, SampledWavelengths &lambda,
                                   SamplerHandle sampler, ScratchBuffer &scratchBuffer,
                                   VisibleSurface *visibleSurf) const {
    // Declare local variables for _PathIntegrator::Li()_
    SampledSpectrum L(0.f), beta(1.f);
    int depth = 0;

    Float bsdfPDF, etaScale = 1;
    bool specularBounce = false, anyNonSpecularBounces = false;
    LightSampleContext prevIntrCtx;

    while (true) {
        // Find next path vertex and accumulate contribution
        pstd::optional<ShapeIntersection> si = Intersect(ray);
        // Add emitted light at path vertex or from the environment
        if (!si) {
            // Incorporate emission from infinite lights for escaped ray
            for (const auto &light : infiniteLights) {
                SampledSpectrum Le = light.Le(ray, lambda);
                if (depth == 0 || specularBounce)
                    L += SafeDiv(beta * Le, lambda.PDF());
                else {
                    // Compute MIS weight for infinite light
                    Float lightPDF =
                        lightSampler.PDF(prevIntrCtx, light) *
                        light.PDF_Li(prevIntrCtx, ray.d, LightSamplingMode::WithMIS);
                    Float weight = PowerHeuristic(1, bsdfPDF, 1, lightPDF);

                    L += SafeDiv(beta * weight * Le, lambda.PDF());
                }
            }

            break;
        }
        // Incorporate emission from emissive surface hit by ray
        SampledSpectrum Le = si->intr.Le(-ray.d, lambda);
        if (Le) {
            if (depth == 0 || specularBounce)
                L += SafeDiv(beta * Le, lambda.PDF());
            else {
                // Compute MIS weight for area light
                LightHandle areaLight(si->intr.areaLight);
                Float lightPDF =
                    lightSampler.PDF(prevIntrCtx, areaLight) *
                    areaLight.PDF_Li(prevIntrCtx, ray.d, LightSamplingMode::WithMIS);
                Float weight = PowerHeuristic(1, bsdfPDF, 1, lightPDF);

                L += SafeDiv(beta * weight * Le, lambda.PDF());
            }
        }

        SurfaceInteraction &isect = si->intr;
        // Get BSDF and skip over medium boundaries
        BSDF bsdf = isect.GetBSDF(ray, lambda, camera, scratchBuffer, sampler);
        if (!bsdf) {
            isect.SkipIntersection(&ray, si->tHit);
            continue;
        }

        // Initialize _visibleSurf_ at first intersection
        if (depth == 0 && visibleSurf != nullptr) {
            // Estimate BSDF's albedo
            constexpr int nRhoSamples = 16;
            SampledSpectrum rho(0.f);
            for (int i = 0; i < nRhoSamples; ++i) {
                // Generate sample for hemispherical-directional reflectance
                Float uc = RadicalInverse(0, i + 1);
                Point2f u(RadicalInverse(1, i + 1), RadicalInverse(2, i + 1));

                // Estimate one term of $\rho_\roman{hd}$
                pstd::optional<BSDFSample> bs = bsdf.Sample_f(si->intr.wo, uc, u);
                if (bs)
                    rho += bs->f * AbsDot(bs->wi, si->intr.shading.n) / bs->pdf;
            }
            SampledSpectrum albedo = rho / nRhoSamples;

            *visibleSurf =
                VisibleSurface(si->intr, camera.GetCameraTransform(), albedo, lambda);
        }

        // End path if maximum depth reached
        if (depth++ == maxDepth)
            break;

        // Possibly regularize the BSDF
        if (regularize && anyNonSpecularBounces) {
            ++regularizedBSDFs;
            bsdf.Regularize();
        }

        ++totalBSDFs;
        // Sample direct illumination from the light sources
        if (bsdf.IsNonSpecular()) {
            ++totalPaths;
            SampledSpectrum Ld = SampleLd(isect, &bsdf, lambda, sampler);
            if (!Ld)
                ++zeroRadiancePaths;
            L += SafeDiv(beta * Ld, lambda.PDF());
        }

        // Sample BSDF to get new path direction
        Vector3f wo = -ray.d;
        Float u = sampler.Get1D();
        pstd::optional<BSDFSample> bs = bsdf.Sample_f(wo, u, sampler.Get2D());
        if (!bs)
            break;
        // Update path state variables for after surface scattering
        beta *= bs->f * AbsDot(bs->wi, isect.shading.n) / bs->pdf;
        bsdfPDF = bs->pdfIsProportional ? bsdf.PDF(wo, bs->wi) : bs->pdf;
        DCHECK(!IsInf(beta.y(lambda)));
        specularBounce = bs->IsSpecular();
        anyNonSpecularBounces |= !bs->IsSpecular();
        if (bs->IsTransmission())
            etaScale *= Sqr(bs->eta);
        prevIntrCtx = si->intr;

        ray = isect.SpawnRay(ray, bsdf, bs->wi, bs->flags, bs->eta);

        // Possibly terminate the path with Russian roulette
        SampledSpectrum rrBeta = beta * etaScale;
        if (rrBeta.MaxComponentValue() < 1 && depth > 1) {
            Float q = std::max<Float>(0, 1 - rrBeta.MaxComponentValue());
            if (sampler.Get1D() < q)
                break;
            beta /= 1 - q;
            DCHECK(!IsInf(beta.y(lambda)));
        }
    }
    ReportValue(pathLength, depth);
    return L;
}